

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_poll.cpp
# Opt level: O1

void * poll_routine(void *arg)

{
  _Rb_tree_header *p_Var1;
  int __fd;
  uint uVar2;
  uint uVar3;
  stCoRoutine_t *psVar4;
  uint *puVar5;
  char *pcVar6;
  pollfd *__fds;
  long lVar7;
  size_t sVar8;
  int *piVar9;
  long lVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  ulong uVar13;
  nfds_t __nfds;
  long lVar14;
  pollfd *__v;
  set<int,_std::less<int>,_std::allocator<int>_> setRaiseFds;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  co_enable_hook_sys();
  lVar7 = *arg;
  if (*(long *)((long)arg + 8) == lVar7) {
    __nfds = 0;
    lVar10 = 0;
  }
  else {
    lVar14 = 0xc;
    uVar13 = 0;
    do {
      __fd = socket(2,1,6);
      uVar2 = fcntl(__fd,3,0);
      fcntl(__fd,4,(ulong)(uVar2 | 0x800));
      lVar7 = *arg;
      *(int *)(lVar7 + -4 + lVar14) = __fd;
      uVar3 = connect(__fd,(sockaddr *)(lVar7 + lVar14),0x10);
      psVar4 = co_self();
      puVar5 = (uint *)__errno_location();
      uVar2 = *puVar5;
      pcVar6 = strerror(uVar2);
      printf("co %p connect i %ld ret %d errno %d (%s)\n",psVar4,uVar13,(ulong)uVar3,(ulong)uVar2,
             pcVar6);
      uVar13 = uVar13 + 1;
      lVar7 = *arg;
      lVar10 = *(long *)((long)arg + 8) - lVar7;
      __nfds = lVar10 >> 5;
      lVar14 = lVar14 + 0x20;
    } while (uVar13 < __nfds);
  }
  __fds = (pollfd *)calloc(1,lVar10 >> 2);
  if (__nfds != 0) {
    piVar9 = (int *)(lVar7 + 8);
    uVar13 = 0;
    do {
      __fds[uVar13].fd = *piVar9;
      __fds[uVar13].events = 0x1c;
      uVar13 = uVar13 + 1;
      piVar9 = piVar9 + 8;
    } while (__nfds != uVar13);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    uVar2 = poll(__fds,__nfds,1000);
    psVar4 = co_self();
    printf("co %p poll wait %ld ret %d\n",psVar4,__nfds,(ulong)uVar2);
    if (0 < (int)(uint)__nfds) {
      uVar13 = (ulong)((uint)__nfds & 0x7fffffff);
      __v = __fds;
      do {
        psVar4 = co_self();
        printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",psVar4,
               (ulong)(uint)__v->fd,(ulong)(uint)(int)__v->revents,4,8,0x10);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&__v->fd);
        __v = __v + 1;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    lVar7 = *arg;
    sVar8 = *(long *)((long)arg + 8) - lVar7 >> 5;
    if (0 < (int)uVar2 && local_60._M_impl.super__Rb_tree_header._M_node_count != sVar8) {
      if (*(long *)((long)arg + 8) == lVar7) {
        __nfds = 0;
      }
      else {
        lVar10 = 0;
        __nfds = 0;
        do {
          piVar9 = (int *)(lVar10 * 0x20 + lVar7 + 8);
          p_Var11 = &p_Var1->_M_header;
          if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              if (*piVar9 <= (int)p_Var12[1]._M_color) {
                p_Var11 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < *piVar9];
            } while (p_Var12 != (_Base_ptr)0x0);
          }
          p_Var12 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
             (p_Var12 = p_Var11, *piVar9 < (int)p_Var11[1]._M_color)) {
            p_Var12 = &p_Var1->_M_header;
          }
          if ((_Rb_tree_header *)p_Var12 == p_Var1) {
            __fds[__nfds].fd = *piVar9;
            __fds[__nfds].events = 0x1c;
            __nfds = __nfds + 1;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != sVar8 + (sVar8 == 0));
      }
    }
  } while (0 < (int)uVar2 && local_60._M_impl.super__Rb_tree_header._M_node_count != sVar8);
  lVar7 = *arg;
  if (*(long *)((long)arg + 8) != lVar7) {
    lVar10 = 8;
    uVar13 = 0;
    do {
      close(*(int *)(lVar7 + lVar10));
      lVar7 = *arg;
      *(undefined4 *)(lVar7 + lVar10) = 0xffffffff;
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 0x20;
    } while (uVar13 < (ulong)(*(long *)((long)arg + 8) - lVar7 >> 5));
  }
  psVar4 = co_self();
  printf("co %p task cnt %ld fire %ld\n",psVar4,*(long *)((long)arg + 8) - *arg >> 5,
         local_60._M_impl.super__Rb_tree_header._M_node_count);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return (void *)0x0;
}

Assistant:

static void *poll_routine( void *arg )
{
	co_enable_hook_sys();

	vector<task_t> &v = *(vector<task_t>*)arg;
	for(size_t i=0;i<v.size();i++)
	{
		int fd = CreateTcpSocket();
		SetNonBlock( fd );
		v[i].fd = fd;

		int ret = connect(fd,(struct sockaddr*)&v[i].addr,sizeof( v[i].addr )); 
		printf("co %p connect i %ld ret %d errno %d (%s)\n",
			co_self(),i,ret,errno,strerror(errno));
	}
	struct pollfd *pf = (struct pollfd*)calloc( 1,sizeof(struct pollfd) * v.size() );

	for(size_t i=0;i<v.size();i++)
	{
		pf[i].fd = v[i].fd;
		pf[i].events = ( POLLOUT | POLLERR | POLLHUP );
	}
	set<int> setRaiseFds;
	size_t iWaitCnt = v.size();
	for(;;)
	{
		int ret = poll( pf,iWaitCnt,1000 );
		printf("co %p poll wait %ld ret %d\n",
				co_self(),iWaitCnt,ret);
		for(int i=0;i<(int)iWaitCnt;i++)
		{
			printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",
					co_self(),
					pf[i].fd,
					pf[i].revents,
					POLLOUT,
					POLLERR,
					POLLHUP
					);
			setRaiseFds.insert( pf[i].fd );
		}
		if( setRaiseFds.size() == v.size())
		{
			break;
		}
		if( ret <= 0 )
		{
			break;
		}

		iWaitCnt = 0;
		for(size_t i=0;i<v.size();i++)
		{
			if( setRaiseFds.find( v[i].fd ) == setRaiseFds.end() )
			{
				pf[ iWaitCnt ].fd = v[i].fd;
				pf[ iWaitCnt ].events = ( POLLOUT | POLLERR | POLLHUP );
				++iWaitCnt;
			}
		}
	}
	for(size_t i=0;i<v.size();i++)
	{
		close( v[i].fd );
		v[i].fd = -1;
	}

	printf("co %p task cnt %ld fire %ld\n",
			co_self(),v.size(),setRaiseFds.size() );
	return 0;
}